

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

ssize_t __thiscall smf::MidiFile::write(MidiFile *this,int __fd,void *__buf,size_t __n)

{
  char cVar1;
  ostream *poVar2;
  void *__buf_00;
  ulong uVar3;
  undefined4 in_register_00000034;
  undefined8 *puVar4;
  fstream output;
  undefined1 local_220 [16];
  undefined1 local_210 [512];
  
  puVar4 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  std::fstream::fstream(local_220,(char *)*puVar4,_S_out|_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: could not write: ",0x18);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)*puVar4,puVar4[1]);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    uVar3 = 0;
  }
  else {
    write(this,(int)local_210,__buf_00,__n);
    this->m_rwstatus = true;
    std::fstream::close();
    uVar3 = CONCAT71((int7)((ulong)this >> 8),this->m_rwstatus);
  }
  std::fstream::~fstream(local_220);
  return uVar3 & 0xffffffff;
}

Assistant:

bool MidiFile::write(const std::string& filename) {
	std::fstream output(filename.c_str(), std::ios::binary | std::ios::out);

	if (!output.is_open()) {
		std::cerr << "Error: could not write: " << filename << std::endl;
		return false;
	}
	m_rwstatus = write(output);
	output.close();
	return m_rwstatus;
}